

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stream_input.c
# Opt level: O2

int streamDispatch(mpt_input *in,mpt_event_handler_t cmd,void *arg)

{
  mpt_input *pmVar1;
  _mpt_vptr_input *p_Var2;
  int iVar3;
  streamWrap sw;
  mpt_input *local_48;
  mpt_event_handler_t local_40;
  void *local_38;
  
  pmVar1 = in + 3;
  p_Var2 = in[0xb]._vptr;
  if ((long)p_Var2 < 0) {
    iVar3 = mpt_queue_recv(pmVar1);
    if (iVar3 < 0) {
      return iVar3;
    }
    if (iVar3 == 0) {
      _mpt_stream_fread((mpt_streaminfo *)(in + 2));
      return 0;
    }
  }
  if (cmd == (mpt_event_handler_t)0x0) {
    in[9]._vptr = (_mpt_vptr_input *)
                  ((long)&(p_Var2->meta).convertable.convert +
                  (long)&((in[9]._vptr)->meta).convertable.convert);
    in[10]._vptr = (_mpt_vptr_input *)((long)in[10]._vptr - (long)p_Var2);
    in[0xb]._vptr = (_mpt_vptr_input *)0xffffffffffffffff;
    mpt_queue_shift(pmVar1);
    iVar3 = mpt_queue_recv(pmVar1);
    iVar3 = (uint)(0 < iVar3) << 0x10;
  }
  else {
    local_48 = in;
    local_40 = cmd;
    local_38 = arg;
    iVar3 = mpt_stream_dispatch((mpt_stream *)(in + 2),streamMessage,&local_48);
  }
  return iVar3;
}

Assistant:

static int streamDispatch(MPT_INTERFACE(input) *in, MPT_TYPE(event_handler) cmd, void *arg)
{
	MPT_STRUCT(streamInput) *srm = (void *) in;
	ssize_t len;
	int ret;
	
	if ((len = srm->data._rd._state.data.msg) < 0) {
		if ((ret = mpt_queue_recv(&srm->data._rd)) < 0) {
			return ret;
		}
		if (!ret) {
			if ((ret = _mpt_stream_fread(&srm->data._info)) < 0) {
				return 0;
			} else {
				return MPT_EVENTFLAG(None);
			}
		}
	}
	if (cmd) {
		struct streamWrap sw;
		sw.in = srm;
		sw.cmd = cmd;
		sw.arg = arg;
		return mpt_stream_dispatch(&srm->data, streamMessage, &sw);
	}
	srm->data._rd._state.data.pos += len;
	srm->data._rd._state.data.len -= len;
	srm->data._rd._state.data.msg = -1;
	mpt_queue_shift(&srm->data._rd);
	
	ret = mpt_queue_recv(&srm->data._rd);
	
	return (ret > 0) ? MPT_EVENTFLAG(Retry) : MPT_EVENTFLAG(None);
}